

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O0

void ssh2_send_packet_from_downstream
               (ConnectionLayer *cl,uint id,int type,void *data,int datalen,
               char *additional_log_text)

{
  PktOut *pPVar1;
  PktOut *pkt;
  ssh2_connection_state *s;
  char *additional_log_text_local;
  int datalen_local;
  void *data_local;
  int type_local;
  uint id_local;
  ConnectionLayer *cl_local;
  
  pPVar1 = ssh_bpp_new_pktout((BinaryPacketProtocol *)cl[1].vt,type);
  pPVar1->downstream_id = id;
  pPVar1->additional_log_text = additional_log_text;
  BinarySink_put_data(pPVar1->binarysink_,data,(long)datalen);
  pq_base_push((PacketQueueBase *)cl[2].vt,&pPVar1->qnode);
  return;
}

Assistant:

static void ssh2_send_packet_from_downstream(
        ConnectionLayer *cl, unsigned id, int type,
        const void *data, int datalen, const char *additional_log_text)
{
    struct ssh2_connection_state *s =
        container_of(cl, struct ssh2_connection_state, cl);
    PktOut *pkt = ssh_bpp_new_pktout(s->ppl.bpp, type);
    pkt->downstream_id = id;
    pkt->additional_log_text = additional_log_text;
    put_data(pkt, data, datalen);
    pq_push(s->ppl.out_pq, pkt);
}